

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void,_supermap::Key<4UL>_>
::find(SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void,_supermap::Key<4UL>_>
       *this,Key<4UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
            *equal)

{
  bool bVar1;
  long lVar2;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *pKVar3;
  long *in_RSI;
  optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> *in_RDI;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> firstLeqElem;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> middleElem;
  unsigned_long middle;
  unsigned_long lastGt;
  unsigned_long firstLeq;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *in_stack_ffffffffffffff38;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *__args;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> local_78 [2];
  undefined1 local_58 [16];
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *local_48;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *local_40;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *local_38;
  
  lVar2 = (**(code **)(*in_RSI + 8))();
  if (lVar2 == 0) {
    std::optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>::optional
              (in_RDI);
  }
  else {
    local_38 = (KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *)0x0;
    local_40 = (KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *)
               (**(code **)(*in_RSI + 8))();
    while (1 < (ulong)((long)local_40 - (long)local_38)) {
      local_48 = (KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *)
                 ((ulong)((local_40->key).super_array<unsigned_char,_4UL>._M_elems +
                         (long)(local_38->key).super_array<unsigned_char,_4UL>._M_elems) >> 1);
      (**(code **)(*in_RSI + 0x20))(local_58,in_RSI,local_48);
      bVar1 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
              ::operator()((function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
                            *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff38,
                           (Key<4UL> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)
                          );
      if (bVar1) {
LAB_001f51d9:
        local_38 = local_48;
      }
      else {
        in_stack_ffffffffffffff47 =
             std::
             function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
             ::operator()((function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
                           *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff38,
                          (Key<4UL> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30))
        ;
        if ((bool)in_stack_ffffffffffffff47) goto LAB_001f51d9;
        local_40 = local_48;
      }
      KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>::~KeyValue
                ((KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *)0x1f5228);
    }
    __args = local_38;
    pKVar3 = (KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *)
             (**(code **)(*in_RSI + 8))();
    if (__args < pKVar3) {
      pKVar3 = local_78;
      (**(code **)(*in_RSI + 0x20))(pKVar3,in_RSI,local_38);
      bVar1 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
              ::operator()((function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
                            *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__args,
                           (Key<4UL> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)
                          );
      if (bVar1) {
        std::optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>::
        optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_true>
                  ((optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> *)
                   CONCAT17(bVar1,in_stack_ffffffffffffff30),pKVar3);
      }
      else {
        std::optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>::optional
                  (in_RDI);
      }
      KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>::~KeyValue
                ((KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *)0x1f52cd);
    }
    else {
      std::optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>::optional
                (in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }